

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

EC_POINT * x9_62_decode_point(EC_GROUP *group,ptls_iovec_t vec,BN_CTX *bn_ctx)

{
  int iVar1;
  EC_POINT *p;
  
  p = EC_POINT_new((EC_GROUP *)group);
  if (p != (EC_POINT *)0x0) {
    iVar1 = EC_POINT_oct2point((EC_GROUP *)group,p,vec.base,vec.len,(BN_CTX *)bn_ctx);
    if (iVar1 != 0) {
      return (EC_POINT *)p;
    }
    EC_POINT_free(p);
  }
  return (EC_POINT *)0x0;
}

Assistant:

static EC_POINT *x9_62_decode_point(EC_GROUP *group, ptls_iovec_t vec, BN_CTX *bn_ctx)
{
    EC_POINT *point = NULL;

    if ((point = EC_POINT_new(group)) == NULL)
        return NULL;
    if (!EC_POINT_oct2point(group, point, vec.base, vec.len, bn_ctx)) {
        EC_POINT_free(point);
        return NULL;
    }

    return point;
}